

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::ssl_set_cert(CERT *cert,UniquePtr<CRYPTO_BUFFER> *buffer)

{
  bool bVar1;
  pointer this;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_28;
  UniquePtr<CRYPTO_BUFFER> *local_20;
  UniquePtr<CRYPTO_BUFFER> *buffer_local;
  CERT *cert_local;
  
  local_20 = buffer;
  buffer_local = (UniquePtr<CRYPTO_BUFFER> *)cert;
  this = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                   (&cert->legacy_credential);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr(&local_28,buffer);
  bVar1 = ssl_credential_st::SetLeafCert(this,&local_28,true);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    (*(code *)buffer_local[4]._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl[1].data)(buffer_local);
  }
  return bVar1;
}

Assistant:

bool ssl_set_cert(CERT *cert, UniquePtr<CRYPTO_BUFFER> buffer) {
  // Don't fail for a cert/key mismatch, just free the current private key.
  // (When switching to a different keypair, the caller should switch the
  // certificate, then the key.)
  if (!cert->legacy_credential->SetLeafCert(std::move(buffer),
                                            /*discard_key_on_mismatch=*/true)) {
    return false;
  }

  cert->x509_method->cert_flush_cached_leaf(cert);
  return true;
}